

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O2

void JumpMission(int linenumber)

{
  int iVar1;
  char *__s;
  
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  if (bMissionRunning == 0) {
    __s = "Cannot use jump outside a mission file.";
  }
  else if (linenumber < 1) {
    __s = "Invalid parameter.";
  }
  else {
    iVar1 = fsetline(missionfile,linenumber);
    if (iVar1 == 0) goto LAB_0012e4c4;
    __s = "jump failed.";
  }
  puts(__s);
LAB_0012e4c4:
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void JumpMission(int linenumber)
{
	EnterCriticalSection(&MissionFilesCS);
	if (bMissionRunning)
	{
		if (linenumber > 0)
		{
			if (fsetline(missionfile, linenumber) != EXIT_SUCCESS)
			{
				printf("jump failed.\n");
			}
		}
		else
		{
			printf("Invalid parameter.\n");
		}
	}
	else
	{
		printf("Cannot use jump outside a mission file.\n");
	}
	LeaveCriticalSection(&MissionFilesCS);
}